

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O3

void cmSystemTools::Stdout(string *s)

{
  undefined8 in_RDX;
  
  if ((anonymous_namespace)::s_StdoutCallback_abi_cxx11_._16_8_ != 0) {
    (*(code *)(anonymous_namespace)::s_StdoutCallback_abi_cxx11_._24_8_)
              ((anonymous_namespace)::s_StdoutCallback_abi_cxx11_,s,in_RDX,
               (anonymous_namespace)::s_StdoutCallback_abi_cxx11_._24_8_);
    return;
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,(s->_M_dataplus)._M_p,s->_M_string_length);
  std::ostream::flush();
  return;
}

Assistant:

void cmSystemTools::Stdout(const std::string& s)
{
  if (s_StdoutCallback) {
    s_StdoutCallback(s);
  } else {
    std::cout << s << std::flush;
  }
}